

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkCountRealPis(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int Count;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  local_20 = 0;
  Wlc_NtkMarkCone(p,-1,-1,1,0);
  for (local_1c = 0; iVar1 = Wlc_NtkPiNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pWVar2 = Wlc_NtkPi(p,local_1c);
    local_20 = (uint)(*(ushort *)pWVar2 >> 7 & 1) + local_20;
  }
  Wlc_NtkCleanMarks(p);
  return local_20;
}

Assistant:

int Wlc_NtkCountRealPis( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i, Count = 0;
    Wlc_NtkMarkCone( p, -1, -1, 1, 0 );
    Wlc_NtkForEachPi( p, pObj, i )
        Count += pObj->Mark;
    Wlc_NtkCleanMarks( p );
    return Count;
}